

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
ipx::Model::DualizeBasicSolution
          (Model *this,Vector *x_user,Vector *slack_user,Vector *y_user,Vector *z_user,
          Vector *x_solver,Vector *y_solver,Vector *z_solver)

{
  double dVar1;
  Int IVar2;
  Int IVar3;
  double *pdVar4;
  size_type sVar5;
  const_reference pvVar6;
  valarray<double> *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar7;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  Model *in_RDI;
  valarray<double> *in_R9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  valarray<double> *in_stack_00000008;
  valarray<double> *in_stack_00000010;
  Int i_2;
  Int j_1;
  size_t k_1;
  Int i_1;
  Int j;
  size_t k;
  Int i;
  Int n;
  Int m;
  valarray<double> *in_stack_fffffffffffffed8;
  valarray<double> *in_stack_fffffffffffffee0;
  double dVar8;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Int IVar9;
  undefined8 in_stack_ffffffffffffff00;
  int iVar10;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  Int IVar11;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  valarray<double> *in_stack_ffffffffffffff20;
  int local_68;
  ulong local_60;
  int local_58;
  ulong local_50;
  int local_44;
  
  IVar2 = rows(in_RDI);
  IVar3 = cols(in_RDI);
  iVar10 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  if ((in_RDI->dualized_ & 1U) == 0) {
    std::begin<double>(in_stack_fffffffffffffee0);
    IVar9 = IVar3;
    std::begin<double>(in_stack_fffffffffffffee0);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),iVar10,
               (double *)CONCAT44(IVar9,in_stack_fffffffffffffef8));
    pdVar4 = std::begin<double>(in_stack_fffffffffffffee0);
    iVar10 = (int)((ulong)pdVar4 >> 0x20);
    IVar11 = IVar2;
    std::begin<double>(in_stack_fffffffffffffee0);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(IVar11,in_stack_ffffffffffffff08),iVar10,
               (double *)CONCAT44(IVar9,in_stack_fffffffffffffef8));
    std::begin<double>(in_stack_fffffffffffffee0);
    std::begin<double>(in_stack_fffffffffffffee0);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(IVar11,in_stack_ffffffffffffff08),iVar10,
               (double *)CONCAT44(IVar9,in_stack_fffffffffffffef8));
    std::begin<double>(in_stack_fffffffffffffee0);
    std::begin<double>(in_stack_fffffffffffffee0);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(IVar11,in_stack_ffffffffffffff08),iVar10,
               (double *)CONCAT44(IVar9,in_stack_fffffffffffffef8));
    pvVar7 = extraout_RDX_02;
    for (local_68 = 0; local_68 < IVar2; local_68 = local_68 + 1) {
      c(in_RDI,(void *)(ulong)(uint)(IVar3 + local_68),pvVar7);
      dVar8 = extraout_XMM0_Qa_01;
      pdVar4 = std::valarray<double>::operator[](in_stack_00000008,(long)local_68);
      dVar1 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](in_stack_00000010,(long)(IVar3 + local_68));
      *pdVar4 = dVar8 - dVar1;
      pvVar7 = extraout_RDX_03;
    }
  }
  else {
    std::valarray<double>::operator-(in_stack_fffffffffffffed8);
    std::valarray<double>::operator=
              (in_stack_ffffffffffffff20,
               (_Expr<std::__detail::_UnClos<std::__negate,_std::_ValArray,_double>,_double> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    for (local_44 = 0; local_44 < in_RDI->num_constr_; local_44 = local_44 + 1) {
      pdVar4 = std::valarray<double>::operator[](in_RDX,(long)local_44);
      dVar1 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](in_stack_00000010,(long)local_44);
      *pdVar4 = -dVar1;
    }
    for (local_50 = 0; sVar5 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->boxed_vars_),
        local_50 < sVar5; local_50 = local_50 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->boxed_vars_,local_50);
      iVar10 = *pvVar6;
      c(in_RDI,(void *)(ulong)(uint)(in_RDI->num_constr_ + (int)local_50),extraout_RDX_00);
      pdVar4 = std::valarray<double>::operator[](in_stack_00000008,(long)iVar10);
      dVar1 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[]
                         (in_stack_00000010,(long)in_RDI->num_constr_ + local_50);
      *pdVar4 = extraout_XMM0_Qa + dVar1;
    }
    pvVar7 = extraout_RDX;
    for (local_58 = 0; iVar10 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20), local_58 < IVar2;
        local_58 = local_58 + 1) {
      c(in_RDI,(void *)(ulong)(uint)(IVar3 + local_58),pvVar7);
      pdVar4 = std::valarray<double>::operator[](in_stack_00000008,(long)local_58);
      dVar1 = *pdVar4;
      pdVar4 = std::valarray<double>::operator[](in_stack_00000010,(long)(IVar3 + local_58));
      *pdVar4 = extraout_XMM0_Qa_00 - dVar1;
      pvVar7 = extraout_RDX_01;
    }
    std::begin<double>(in_stack_fffffffffffffee0);
    std::begin<double>(in_stack_fffffffffffffee0);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),iVar10,
               (double *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::begin<double>(in_stack_fffffffffffffee0);
    std::begin<double>(in_stack_fffffffffffffee0);
    std::copy_n<double_const*,int,double*>
              ((double *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),iVar10,
               (double *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    for (local_60 = 0; sVar5 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->boxed_vars_),
        local_60 < sVar5; local_60 = local_60 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->boxed_vars_,local_60);
      iVar10 = *pvVar6;
      pdVar4 = std::valarray<double>::operator[](in_R9,(long)(IVar3 + iVar10));
      if (0.0 < *pdVar4 || *pdVar4 == 0.0) {
        pdVar4 = std::valarray<double>::operator[](in_R9,(long)in_RDI->num_constr_ + local_60);
        *pdVar4 = 0.0;
      }
      else {
        pdVar4 = std::valarray<double>::operator[](in_R9,(long)(IVar3 + iVar10));
        dVar1 = *pdVar4;
        pdVar4 = std::valarray<double>::operator[](in_R9,(long)in_RDI->num_constr_ + local_60);
        *pdVar4 = -dVar1;
        pdVar4 = std::valarray<double>::operator[](in_R9,(long)(IVar3 + iVar10));
        *pdVar4 = 0.0;
      }
    }
  }
  return;
}

Assistant:

void Model::DualizeBasicSolution(const Vector& x_user,
                                 const Vector& slack_user,
                                 const Vector& y_user,
                                 const Vector& z_user,
                                 Vector& x_solver,
                                 Vector& y_solver,
                                 Vector& z_solver) const {
    const Int m = rows();
    const Int n = cols();

    if (dualized_) {
        assert(num_var_ == m);
        assert(num_constr_ + boxed_vars_.size() == static_cast<size_t>(n));

        // Build dual solver variables from primal user variables.
        y_solver = -x_user;
        for (Int i = 0; i < num_constr_; i++)
            z_solver[i] = -slack_user[i];
        for (size_t k = 0; k < boxed_vars_.size(); k++) {
            Int j = boxed_vars_[k];
            z_solver[num_constr_+k] = c(num_constr_+k) + y_solver[j];
        }
        for (Int i = 0; i < m; i++)
            z_solver[n+i] = c(n+i)-y_solver[i];

        // Build primal solver variables from dual user variables.
        std::copy_n(std::begin(y_user), num_constr_, std::begin(x_solver));
        std::copy_n(std::begin(z_user), num_var_, std::begin(x_solver) + n);
        for (size_t k = 0; k < boxed_vars_.size(); k++) {
            Int j = boxed_vars_[k];
            if (x_solver[n+j] < 0.0) {
                // j is a boxed variable and z_user[j] < 0
                x_solver[num_constr_+k] = -x_solver[n+j];
                x_solver[n+j] = 0.0;
            } else {
                x_solver[num_constr_+k] = 0.0;
            }
        }
    }
    else {
        assert(num_constr_ == m);
        assert(num_var_ == n);
        std::copy_n(std::begin(x_user), n, std::begin(x_solver));
        std::copy_n(std::begin(slack_user), m, std::begin(x_solver) + n);
        std::copy_n(std::begin(y_user), m, std::begin(y_solver));
        std::copy_n(std::begin(z_user), n, std::begin(z_solver));
        for (Int i = 0; i < m; i++)
            z_solver[n+i] = c(n+i)-y_solver[i];
    }
}